

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_sched.cpp
# Opt level: O0

void __kmp_for_static_init<unsigned_long_long>
               (ident_t *loc,kmp_int32 global_tid,kmp_int32 schedtype,kmp_int32 *plastiter,
               unsigned_long_long *plower,unsigned_long_long *pupper,signed_t_conflict *pstride,
               signed_t_conflict incr,signed_t_conflict chunk,void *codeptr)

{
  uint uVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint *in_RCX;
  ulong uVar6;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  bool bVar7;
  uint64_t *in_stack_00000008;
  ulong in_stack_00000010;
  ulong in_stack_00000018;
  void *in_stack_00000020;
  kmp_uint64 cur_chunk;
  UT span_1;
  unsigned_long_long old_upper_1;
  ST span;
  unsigned_long_long old_upper;
  unsigned_long_long big_chunk_inc_count;
  UT extras;
  UT small_chunk;
  kmp_int8 bool_res;
  ompt_work_t ompt_work_type;
  ompt_task_info_t *task_info;
  ompt_team_info_t *team_info;
  kmp_info_t *th;
  kmp_team_t *team;
  UT trip_count;
  kmp_uint32 nth;
  kmp_uint32 tid;
  kmp_int32 gtid;
  ident_t *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  int depth;
  bool local_122;
  bool local_121;
  ident_t *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  ulong local_108;
  kmp_uint64 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  kmp_uint64 in_stack_ffffffffffffff18;
  ident_t *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  undefined1 local_80 [16];
  undefined4 local_70;
  undefined4 in_stack_ffffffffffffff94;
  ompt_work_t local_64;
  ompt_task_info_t *poVar8;
  ompt_data_t *poVar9;
  kmp_info_t *pkVar10;
  kmp_team_p *local_48;
  ulong local_40;
  uint local_30;
  int local_10;
  
  depth = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  pkVar10 = __kmp_threads[in_ESI];
  poVar9 = (ompt_data_t *)0x0;
  poVar8 = (ompt_task_info_t *)0x0;
  local_64 = ompt_work_loop;
  if (((ulong)ompt_enabled >> 0x14 & 1) != 0) {
    poVar9 = &__ompt_get_teaminfo((int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                                  in_stack_fffffffffffffea0)->parallel_data;
    poVar8 = __ompt_get_task_info_object(depth);
    if (in_RDI != 0) {
      if ((*(uint *)(in_RDI + 4) & 0x200) == 0) {
        if ((*(uint *)(in_RDI + 4) & 0x400) == 0) {
          if ((*(uint *)(in_RDI + 4) & 0x800) == 0) {
            LOCK();
            bVar7 = __kmp_for_static_init<unsigned_long_long>::warn == '\0';
            if (bVar7) {
              __kmp_for_static_init<unsigned_long_long>::warn = '\x01';
            }
            UNLOCK();
            if (bVar7) {
              __kmp_msg_format((uint)local_80,0x400bc);
              in_stack_fffffffffffffe98 = (ident_t *)CONCAT44(in_stack_ffffffffffffff94,local_70);
              in_stack_fffffffffffffea0 = (int *)__kmp_msg_null._0_8_;
              __kmp_msg(kmp_ms_warning);
            }
          }
          else {
            local_64 = ompt_work_distribute;
          }
        }
        else {
          local_64 = ompt_work_sections;
        }
      }
      else {
        local_64 = ompt_work_loop;
      }
    }
  }
  if ((__kmp_env_consistency_check != 0) &&
     (__kmp_push_workshare
                ((int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                 (cons_type)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98),
     in_stack_00000010 == 0)) {
    __kmp_error_construct
              ((kmp_i18n_id_t)((ulong)in_stack_fffffffffffffef0 >> 0x20),
               (cons_type)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  if ((long)in_stack_00000010 < 1) {
    if (*in_R8 < *in_R9) goto LAB_001aac5b;
  }
  else if (*in_R9 < *in_R8) {
LAB_001aac5b:
    if (in_RCX != (uint *)0x0) {
      *in_RCX = 0;
    }
    *in_stack_00000008 = in_stack_00000010;
    if (((ulong)ompt_enabled >> 0x14 & 1) == 0) {
      return;
    }
    (*ompt_callbacks.ompt_callback_work_callback)
              (local_64,ompt_scope_begin,poVar9,&poVar8->task_data,0,in_stack_00000020);
    return;
  }
  if (in_EDX < 0x49) {
    local_30 = __kmp_tid_from_gtid(in_ESI);
    local_48 = (pkVar10->th).th_team;
    local_10 = in_EDX;
  }
  else {
    local_10 = in_EDX + -0x3a;
    local_30 = (((pkVar10->th).th_team)->t).t_master_tid;
    local_48 = (((pkVar10->th).th_team)->t).t_parent;
  }
  if ((local_48->t).t_serialized == 0) {
    uVar1 = (local_48->t).t_nproc;
    if (uVar1 == 1) {
      if (in_RCX != (uint *)0x0) {
        *in_RCX = 1;
      }
      if ((long)in_stack_00000010 < 1) {
        uVar2 = -((*in_R8 - *in_R9) + 1);
      }
      else {
        uVar2 = (*in_R9 - *in_R8) + 1;
      }
      *in_stack_00000008 = uVar2;
      if (((ulong)ompt_enabled >> 0x14 & 1) != 0) {
        (*ompt_callbacks.ompt_callback_work_callback)
                  (local_64,ompt_scope_begin,poVar9,&poVar8->task_data,*in_stack_00000008,
                   in_stack_00000020);
      }
    }
    else {
      if (in_stack_00000010 == 1) {
        uVar3 = *in_R9 - *in_R8;
      }
      else if (in_stack_00000010 == 0xffffffffffffffff) {
        uVar3 = *in_R8 - *in_R9;
      }
      else if ((long)in_stack_00000010 < 1) {
        uVar3 = (*in_R8 - *in_R9) / -in_stack_00000010;
      }
      else {
        uVar3 = (*in_R9 - *in_R8) / in_stack_00000010;
      }
      local_40 = uVar3 + 1;
      if (((__kmp_env_consistency_check != 0) && (local_40 == 0)) && (*in_R9 != *in_R8)) {
        __kmp_error_construct
                  ((kmp_i18n_id_t)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                   (cons_type)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
      if (local_10 == 0x21) {
        if ((long)in_stack_00000018 < 1) {
          in_stack_00000018 = 1;
        }
        lVar5 = in_stack_00000018 * in_stack_00000010;
        *in_stack_00000008 = lVar5 * (ulong)uVar1;
        *in_R8 = *in_R8 + lVar5 * (ulong)local_30;
        *in_R9 = (*in_R8 + lVar5) - in_stack_00000010;
        if (in_RCX != (uint *)0x0) {
          *in_RCX = (uint)((ulong)local_30 == (uVar3 / in_stack_00000018) % (ulong)uVar1);
        }
      }
      else if (local_10 == 0x22) {
        if (local_40 < uVar1) {
          if (local_30 < local_40) {
            uVar6 = *in_R8 + local_30 * in_stack_00000010;
            *in_R8 = uVar6;
            *in_R9 = uVar6;
          }
          else {
            *in_R8 = *in_R9 + in_stack_00000010;
          }
          if (in_RCX != (uint *)0x0) {
            *in_RCX = (uint)(local_30 == uVar3);
          }
        }
        else if (__kmp_static == kmp_sch_static_balanced) {
          uVar3 = local_40 % (ulong)uVar1;
          in_stack_ffffffffffffff08 = (ulong)local_30 * (local_40 / uVar1);
          local_108 = uVar3;
          if (local_30 < uVar3) {
            local_108 = (ulong)local_30;
          }
          *in_R8 = in_stack_00000010 * (in_stack_ffffffffffffff08 + local_108) + *in_R8;
          lVar5 = (local_40 / uVar1) * in_stack_00000010;
          if (local_30 < uVar3) {
            in_stack_00000010 = 0;
          }
          *in_R9 = (*in_R8 + lVar5) - in_stack_00000010;
          if (in_RCX != (uint *)0x0) {
            *in_RCX = (uint)(local_30 == uVar1 - 1);
          }
        }
        else {
          lVar5 = (local_40 / uVar1 + (long)(int)(uint)(local_40 % (ulong)uVar1 != 0)) *
                  in_stack_00000010;
          uVar3 = *in_R9;
          *in_R8 = (ulong)local_30 * lVar5 + *in_R8;
          *in_R9 = (*in_R8 + lVar5) - in_stack_00000010;
          if ((long)in_stack_00000010 < 1) {
            if (*in_R8 < *in_R9) {
              *in_R9 = 0;
            }
            if (in_RCX != (uint *)0x0) {
              local_122 = false;
              if (uVar3 <= *in_R8) {
                local_122 = *in_R9 < uVar3 - in_stack_00000010;
              }
              *in_RCX = (uint)local_122;
            }
            if (*in_R9 < uVar3) {
              *in_R9 = uVar3;
            }
          }
          else {
            if (*in_R9 < *in_R8) {
              *in_R9 = 0xffffffffffffffff;
            }
            if (in_RCX != (uint *)0x0) {
              local_121 = false;
              if (*in_R8 <= uVar3) {
                local_121 = uVar3 - in_stack_00000010 < *in_R9;
              }
              *in_RCX = (uint)local_121;
            }
            if (uVar3 < *in_R9) {
              *in_R9 = uVar3;
            }
          }
        }
        *in_stack_00000008 = local_40;
      }
      else if (local_10 == 0x2d) {
        uVar6 = *in_R9;
        uVar4 = (((local_40 + uVar1) - 1) / (ulong)uVar1 + in_stack_00000018) - 1 &
                (in_stack_00000018 - 1 ^ 0xffffffffffffffff);
        lVar5 = uVar4 * in_stack_00000010;
        *in_R8 = *in_R8 + lVar5 * (ulong)local_30;
        *in_R9 = (*in_R8 + lVar5) - in_stack_00000010;
        if ((long)in_stack_00000010 < 1) {
          if (*in_R9 < uVar6) {
            *in_R9 = uVar6;
          }
        }
        else if (uVar6 < *in_R9) {
          *in_R9 = uVar6;
        }
        if (in_RCX != (uint *)0x0) {
          *in_RCX = (uint)((ulong)local_30 == uVar3 / uVar4);
        }
      }
      else {
        __kmp_debug_assert(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                           (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      }
      if (((local_30 == 0) && (__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0))
         && ((__kmp_forkjoin_frames_mode == 3 &&
             (((pkVar10->th).th_teams_microtask == (microtask_t)0x0 &&
              ((local_48->t).t_active_level == 1)))))) {
        __kmp_itt_metadata_loop
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   CONCAT44(local_10,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08);
      }
      if (((ulong)ompt_enabled >> 0x14 & 1) != 0) {
        (*ompt_callbacks.ompt_callback_work_callback)
                  (local_64,ompt_scope_begin,poVar9,&poVar8->task_data,local_40,in_stack_00000020);
      }
    }
  }
  else {
    if (in_RCX != (uint *)0x0) {
      *in_RCX = 1;
    }
    if ((long)in_stack_00000010 < 1) {
      uVar2 = -((*in_R8 - *in_R9) + 1);
    }
    else {
      uVar2 = (*in_R9 - *in_R8) + 1;
    }
    *in_stack_00000008 = uVar2;
    if (((ulong)ompt_enabled >> 0x14 & 1) != 0) {
      (*ompt_callbacks.ompt_callback_work_callback)
                (local_64,ompt_scope_begin,poVar9,&poVar8->task_data,*in_stack_00000008,
                 in_stack_00000020);
    }
  }
  return;
}

Assistant:

static void __kmp_for_static_init(ident_t *loc, kmp_int32 global_tid,
                                  kmp_int32 schedtype, kmp_int32 *plastiter,
                                  T *plower, T *pupper,
                                  typename traits_t<T>::signed_t *pstride,
                                  typename traits_t<T>::signed_t incr,
                                  typename traits_t<T>::signed_t chunk
#if OMPT_SUPPORT && OMPT_OPTIONAL
                                  ,
                                  void *codeptr
#endif
                                  ) {
  KMP_COUNT_BLOCK(OMP_LOOP_STATIC);
  KMP_PUSH_PARTITIONED_TIMER(OMP_loop_static);
  KMP_PUSH_PARTITIONED_TIMER(OMP_loop_static_scheduling);

  typedef typename traits_t<T>::unsigned_t UT;
  typedef typename traits_t<T>::signed_t ST;
  /*  this all has to be changed back to TID and such.. */
  kmp_int32 gtid = global_tid;
  kmp_uint32 tid;
  kmp_uint32 nth;
  UT trip_count;
  kmp_team_t *team;
  kmp_info_t *th = __kmp_threads[gtid];

#if OMPT_SUPPORT && OMPT_OPTIONAL
  ompt_team_info_t *team_info = NULL;
  ompt_task_info_t *task_info = NULL;
  ompt_work_t ompt_work_type = ompt_work_loop;

  static kmp_int8 warn = 0;

  if (ompt_enabled.ompt_callback_work) {
    // Only fully initialize variables needed by OMPT if OMPT is enabled.
    team_info = __ompt_get_teaminfo(0, NULL);
    task_info = __ompt_get_task_info_object(0);
    // Determine workshare type
    if (loc != NULL) {
      if ((loc->flags & KMP_IDENT_WORK_LOOP) != 0) {
        ompt_work_type = ompt_work_loop;
      } else if ((loc->flags & KMP_IDENT_WORK_SECTIONS) != 0) {
        ompt_work_type = ompt_work_sections;
      } else if ((loc->flags & KMP_IDENT_WORK_DISTRIBUTE) != 0) {
        ompt_work_type = ompt_work_distribute;
      } else {
        kmp_int8 bool_res =
            KMP_COMPARE_AND_STORE_ACQ8(&warn, (kmp_int8)0, (kmp_int8)1);
        if (bool_res)
          KMP_WARNING(OmptOutdatedWorkshare);
      }
      KMP_DEBUG_ASSERT(ompt_work_type);
    }
  }
#endif

  KMP_DEBUG_ASSERT(plastiter && plower && pupper && pstride);
  KE_TRACE(10, ("__kmpc_for_static_init called (%d)\n", global_tid));
#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format(
        "__kmpc_for_static_init: T#%%d sched=%%d liter=%%d iter=(%%%s,"
        " %%%s, %%%s) incr=%%%s chunk=%%%s signed?<%s>\n",
        traits_t<T>::spec, traits_t<T>::spec, traits_t<ST>::spec,
        traits_t<ST>::spec, traits_t<ST>::spec, traits_t<T>::spec);
    KD_TRACE(100, (buff, global_tid, schedtype, *plastiter, *plower, *pupper,
                   *pstride, incr, chunk));
    __kmp_str_free(&buff);
  }
#endif

  if (__kmp_env_consistency_check) {
    __kmp_push_workshare(global_tid, ct_pdo, loc);
    if (incr == 0) {
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited, ct_pdo,
                            loc);
    }
  }
  /* special handling for zero-trip loops */
  if (incr > 0 ? (*pupper < *plower) : (*plower < *pupper)) {
    if (plastiter != NULL)
      *plastiter = FALSE;
    /* leave pupper and plower set to entire iteration space */
    *pstride = incr; /* value should never be used */
// *plower = *pupper - incr;
// let compiler bypass the illegal loop (like for(i=1;i<10;i--))
// THE LINE COMMENTED ABOVE CAUSED shape2F/h_tests_1.f TO HAVE A FAILURE
// ON A ZERO-TRIP LOOP (lower=1, upper=0,stride=1) - JPH June 23, 2009.
#ifdef KMP_DEBUG
    {
      char *buff;
      // create format specifiers before the debug output
      buff = __kmp_str_format("__kmpc_for_static_init:(ZERO TRIP) liter=%%d "
                              "lower=%%%s upper=%%%s stride = %%%s "
                              "signed?<%s>, loc = %%s\n",
                              traits_t<T>::spec, traits_t<T>::spec,
                              traits_t<ST>::spec, traits_t<T>::spec);
      KD_TRACE(100,
               (buff, *plastiter, *plower, *pupper, *pstride, loc->psource));
      __kmp_str_free(&buff);
    }
#endif
    KE_TRACE(10, ("__kmpc_for_static_init: T#%d return\n", global_tid));

#if OMPT_SUPPORT && OMPT_OPTIONAL
    if (ompt_enabled.ompt_callback_work) {
      ompt_callbacks.ompt_callback(ompt_callback_work)(
          ompt_work_type, ompt_scope_begin, &(team_info->parallel_data),
          &(task_info->task_data), 0, codeptr);
    }
#endif
    KMP_STATS_LOOP_END(OMP_loop_static_iterations);
    return;
  }

  // Although there are schedule enumerations above kmp_ord_upper which are not
  // schedules for "distribute", the only ones which are useful are dynamic, so
  // cannot be seen here, since this codepath is only executed for static
  // schedules.
  if (schedtype > kmp_ord_upper) {
    // we are in DISTRIBUTE construct
    schedtype += kmp_sch_static -
                 kmp_distribute_static; // AC: convert to usual schedule type
    tid = th->th.th_team->t.t_master_tid;
    team = th->th.th_team->t.t_parent;
  } else {
    tid = __kmp_tid_from_gtid(global_tid);
    team = th->th.th_team;
  }

  /* determine if "for" loop is an active worksharing construct */
  if (team->t.t_serialized) {
    /* serialized parallel, each thread executes whole iteration space */
    if (plastiter != NULL)
      *plastiter = TRUE;
    /* leave pupper and plower set to entire iteration space */
    *pstride =
        (incr > 0) ? (*pupper - *plower + 1) : (-(*plower - *pupper + 1));

#ifdef KMP_DEBUG
    {
      char *buff;
      // create format specifiers before the debug output
      buff = __kmp_str_format("__kmpc_for_static_init: (serial) liter=%%d "
                              "lower=%%%s upper=%%%s stride = %%%s\n",
                              traits_t<T>::spec, traits_t<T>::spec,
                              traits_t<ST>::spec);
      KD_TRACE(100, (buff, *plastiter, *plower, *pupper, *pstride));
      __kmp_str_free(&buff);
    }
#endif
    KE_TRACE(10, ("__kmpc_for_static_init: T#%d return\n", global_tid));

#if OMPT_SUPPORT && OMPT_OPTIONAL
    if (ompt_enabled.ompt_callback_work) {
      ompt_callbacks.ompt_callback(ompt_callback_work)(
          ompt_work_type, ompt_scope_begin, &(team_info->parallel_data),
          &(task_info->task_data), *pstride, codeptr);
    }
#endif
    KMP_STATS_LOOP_END(OMP_loop_static_iterations);
    return;
  }
  nth = team->t.t_nproc;
  if (nth == 1) {
    if (plastiter != NULL)
      *plastiter = TRUE;
    *pstride =
        (incr > 0) ? (*pupper - *plower + 1) : (-(*plower - *pupper + 1));
#ifdef KMP_DEBUG
    {
      char *buff;
      // create format specifiers before the debug output
      buff = __kmp_str_format("__kmpc_for_static_init: (serial) liter=%%d "
                              "lower=%%%s upper=%%%s stride = %%%s\n",
                              traits_t<T>::spec, traits_t<T>::spec,
                              traits_t<ST>::spec);
      KD_TRACE(100, (buff, *plastiter, *plower, *pupper, *pstride));
      __kmp_str_free(&buff);
    }
#endif
    KE_TRACE(10, ("__kmpc_for_static_init: T#%d return\n", global_tid));

#if OMPT_SUPPORT && OMPT_OPTIONAL
    if (ompt_enabled.ompt_callback_work) {
      ompt_callbacks.ompt_callback(ompt_callback_work)(
          ompt_work_type, ompt_scope_begin, &(team_info->parallel_data),
          &(task_info->task_data), *pstride, codeptr);
    }
#endif
    KMP_STATS_LOOP_END(OMP_loop_static_iterations);
    return;
  }

  /* compute trip count */
  if (incr == 1) {
    trip_count = *pupper - *plower + 1;
  } else if (incr == -1) {
    trip_count = *plower - *pupper + 1;
  } else if (incr > 0) {
    // upper-lower can exceed the limit of signed type
    trip_count = (UT)(*pupper - *plower) / incr + 1;
  } else {
    trip_count = (UT)(*plower - *pupper) / (-incr) + 1;
  }

#if KMP_STATS_ENABLED
  if (KMP_MASTER_GTID(gtid)) {
    KMP_COUNT_VALUE(OMP_loop_static_total_iterations, trip_count);
  }
#endif

  if (__kmp_env_consistency_check) {
    /* tripcount overflow? */
    if (trip_count == 0 && *pupper != *plower) {
      __kmp_error_construct(kmp_i18n_msg_CnsIterationRangeTooLarge, ct_pdo,
                            loc);
    }
  }

  /* compute remaining parameters */
  switch (schedtype) {
  case kmp_sch_static: {
    if (trip_count < nth) {
      KMP_DEBUG_ASSERT(
          __kmp_static == kmp_sch_static_greedy ||
          __kmp_static ==
              kmp_sch_static_balanced); // Unknown static scheduling type.
      if (tid < trip_count) {
        *pupper = *plower = *plower + tid * incr;
      } else {
        *plower = *pupper + incr;
      }
      if (plastiter != NULL)
        *plastiter = (tid == trip_count - 1);
    } else {
      if (__kmp_static == kmp_sch_static_balanced) {
        UT small_chunk = trip_count / nth;
        UT extras = trip_count % nth;
        *plower += incr * (tid * small_chunk + (tid < extras ? tid : extras));
        *pupper = *plower + small_chunk * incr - (tid < extras ? 0 : incr);
        if (plastiter != NULL)
          *plastiter = (tid == nth - 1);
      } else {
        T big_chunk_inc_count =
            (trip_count / nth + ((trip_count % nth) ? 1 : 0)) * incr;
        T old_upper = *pupper;

        KMP_DEBUG_ASSERT(__kmp_static == kmp_sch_static_greedy);
        // Unknown static scheduling type.

        *plower += tid * big_chunk_inc_count;
        *pupper = *plower + big_chunk_inc_count - incr;
        if (incr > 0) {
          if (*pupper < *plower)
            *pupper = traits_t<T>::max_value;
          if (plastiter != NULL)
            *plastiter = *plower <= old_upper && *pupper > old_upper - incr;
          if (*pupper > old_upper)
            *pupper = old_upper; // tracker C73258
        } else {
          if (*pupper > *plower)
            *pupper = traits_t<T>::min_value;
          if (plastiter != NULL)
            *plastiter = *plower >= old_upper && *pupper < old_upper - incr;
          if (*pupper < old_upper)
            *pupper = old_upper; // tracker C73258
        }
      }
    }
    *pstride = trip_count;
    break;
  }
  case kmp_sch_static_chunked: {
    ST span;
    if (chunk < 1) {
      chunk = 1;
    }
    span = chunk * incr;
    *pstride = span * nth;
    *plower = *plower + (span * tid);
    *pupper = *plower + span - incr;
    if (plastiter != NULL)
      *plastiter = (tid == ((trip_count - 1) / (UT)chunk) % nth);
    break;
  }
  case kmp_sch_static_balanced_chunked: {
    T old_upper = *pupper;
    // round up to make sure the chunk is enough to cover all iterations
    UT span = (trip_count + nth - 1) / nth;

    // perform chunk adjustment
    chunk = (span + chunk - 1) & ~(chunk - 1);

    span = chunk * incr;
    *plower = *plower + (span * tid);
    *pupper = *plower + span - incr;
    if (incr > 0) {
      if (*pupper > old_upper)
        *pupper = old_upper;
    } else if (*pupper < old_upper)
      *pupper = old_upper;

    if (plastiter != NULL)
      *plastiter = (tid == ((trip_count - 1) / (UT)chunk));
    break;
  }
  default:
    KMP_ASSERT2(0, "__kmpc_for_static_init: unknown scheduling type");
    break;
  }

#if USE_ITT_BUILD
  // Report loop metadata
  if (KMP_MASTER_TID(tid) && __itt_metadata_add_ptr &&
      __kmp_forkjoin_frames_mode == 3 && th->th.th_teams_microtask == NULL &&
      team->t.t_active_level == 1) {
    kmp_uint64 cur_chunk = chunk;
    // Calculate chunk in case it was not specified; it is specified for
    // kmp_sch_static_chunked
    if (schedtype == kmp_sch_static) {
      cur_chunk = trip_count / nth + ((trip_count % nth) ? 1 : 0);
    }
    // 0 - "static" schedule
    __kmp_itt_metadata_loop(loc, 0, trip_count, cur_chunk);
  }
#endif
#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format("__kmpc_for_static_init: liter=%%d lower=%%%s "
                            "upper=%%%s stride = %%%s signed?<%s>\n",
                            traits_t<T>::spec, traits_t<T>::spec,
                            traits_t<ST>::spec, traits_t<T>::spec);
    KD_TRACE(100, (buff, *plastiter, *plower, *pupper, *pstride));
    __kmp_str_free(&buff);
  }
#endif
  KE_TRACE(10, ("__kmpc_for_static_init: T#%d return\n", global_tid));

#if OMPT_SUPPORT && OMPT_OPTIONAL
  if (ompt_enabled.ompt_callback_work) {
    ompt_callbacks.ompt_callback(ompt_callback_work)(
        ompt_work_type, ompt_scope_begin, &(team_info->parallel_data),
        &(task_info->task_data), trip_count, codeptr);
  }
#endif

  KMP_STATS_LOOP_END(OMP_loop_static_iterations);
  return;
}